

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockActualCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCheckedActualCall_MockIgnoredActualCallWorksAsItShould_TestShell::
~TEST_MockCheckedActualCall_MockIgnoredActualCallWorksAsItShould_TestShell
          (TEST_MockCheckedActualCall_MockIgnoredActualCallWorksAsItShould_TestShell *this)

{
  TEST_MockCheckedActualCall_MockIgnoredActualCallWorksAsItShould_TestShell *this_local;
  
  ~TEST_MockCheckedActualCall_MockIgnoredActualCallWorksAsItShould_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockCheckedActualCall, MockIgnoredActualCallWorksAsItShould)
{
    MockIgnoredActualCall actual;
    actual.withName("func");
    actual.withCallOrder(1);

    CHECK(false == actual.returnBoolValue());
    CHECK(true == actual.returnBoolValueOrDefault(true));
    CHECK(false == actual.returnBoolValueOrDefault(false));
    CHECK(0 == actual.returnUnsignedLongIntValue());
    CHECK(0 == actual.returnIntValue());
    CHECK(1ul == actual.returnUnsignedLongIntValueOrDefault(1ul));
    CHECK(1 == actual.returnIntValueOrDefault(1));
    CHECK(0 == actual.returnLongIntValue());
    CHECK(1l == actual.returnLongIntValueOrDefault(1l));
    CHECK(0 == actual.returnUnsignedIntValue());
    CHECK(1u == actual.returnUnsignedIntValueOrDefault(1u));
#if CPPUTEST_USE_LONG_LONG
    CHECK(0 == actual.returnLongLongIntValue());
    CHECK(1ll == actual.returnLongLongIntValueOrDefault(1ll));
    CHECK(0 == actual.returnUnsignedLongLongIntValue());
    CHECK(1ull == actual.returnUnsignedLongLongIntValueOrDefault(1ull));
#endif
    DOUBLES_EQUAL(0.0, actual.returnDoubleValue(), 0.0);
    DOUBLES_EQUAL(1.5, actual.returnDoubleValueOrDefault(1.5), 0.0);
    STRCMP_EQUAL("bla", actual.returnStringValueOrDefault("bla"));
    STRCMP_EQUAL("", actual.returnStringValue());
    CHECK(NULLPTR == actual.returnPointerValue());
    CHECK((void*) 0x2 == actual.returnPointerValueOrDefault((void*) 0x2));
    CHECK(NULLPTR == actual.returnConstPointerValue());
    CHECK((const void*) 0x2 == actual.returnConstPointerValueOrDefault((const void*) 0x2));
    CHECK(NULLPTR == actual.returnFunctionPointerValue());
    CHECK((void(*)()) 1 == actual.returnFunctionPointerValueOrDefault((void(*)()) 0x1));
    CHECK_FALSE(actual.hasReturnValue());
    CHECK(actual.returnValue().equals(MockNamedValue("")));
}